

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O0

void __thiscall
tcu::TestNode::TestNode
          (TestNode *this,TestContext *testCtx,TestNodeType nodeType,char *name,char *description,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *children)

{
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__s;
  size_type sVar1;
  const_reference ppTVar2;
  int local_54;
  allocator<char> local_4d;
  int i;
  allocator<char> local_39;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *local_38;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *children_local;
  char *description_local;
  char *name_local;
  TestContext *pTStack_18;
  TestNodeType nodeType_local;
  TestContext *testCtx_local;
  TestNode *this_local;
  
  this->_vptr_TestNode = (_func_int **)&PTR__TestNode_016cf8f0;
  this->m_testCtx = testCtx;
  local_38 = children;
  children_local = (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)description;
  description_local = name;
  name_local._4_4_ = nodeType;
  pTStack_18 = testCtx;
  testCtx_local = (TestContext *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_39);
  std::allocator<char>::~allocator(&local_39);
  __s = children_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_description,(char *)__s,&local_4d);
  std::allocator<char>::~allocator(&local_4d);
  this->m_nodeType = name_local._4_4_;
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::vector(&this->m_children);
  local_54 = 0;
  while( true ) {
    sVar1 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size(local_38);
    if ((int)sVar1 <= local_54) break;
    ppTVar2 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        (local_38,(long)local_54);
    addChild(this,*ppTVar2);
    local_54 = local_54 + 1;
  }
  return;
}

Assistant:

TestNode::TestNode (TestContext& testCtx, TestNodeType nodeType, const char* name, const char* description, const vector<TestNode*>& children)
	: m_testCtx		(testCtx)
	, m_name		(name)
	, m_description	(description)
	, m_nodeType	(nodeType)
{
	DE_ASSERT(isValidCaseName(name));
	for (int i = 0; i < (int)children.size(); i++)
		addChild(children[i]);
}